

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O3

void Js::ProfilingHelpers::ProfiledStRootFld_Jit
               (Var instance,PropertyId propertyId,InlineCacheIndex inlineCacheIndex,Var value,
               void *framePointer)

{
  JavascriptCallStackLayout *pJVar1;
  ScriptFunction *scriptFunction;
  InlineCache *inlineCache;
  
  pJVar1 = JavascriptCallStackLayout::FromFramePointer(framePointer);
  scriptFunction =
       UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)pJVar1);
  inlineCache = GetInlineCache(scriptFunction,inlineCacheIndex);
  ProfiledStFld<true>(instance,propertyId,inlineCache,inlineCacheIndex,value,PropertyOperation_Root,
                      scriptFunction,instance);
  return;
}

Assistant:

void ProfilingHelpers::ProfiledStRootFld_Jit(
        const Var instance,
        const PropertyId propertyId,
        const InlineCacheIndex inlineCacheIndex,
        const Var value,
        void *const framePointer)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledStRootFld);
        ScriptFunction *const scriptFunction =
            UnsafeVarTo<ScriptFunction>(JavascriptCallStackLayout::FromFramePointer(framePointer)->functionObject);
        ProfiledStFld<true>(
            instance,
            propertyId,
            GetInlineCache(scriptFunction, inlineCacheIndex),
            inlineCacheIndex,
            value,
            PropertyOperation_Root,
            scriptFunction,
            instance);
        JIT_HELPER_END(ProfiledStRootFld);
    }